

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall PathParser::parse(PathParser *this)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  Point PVar5;
  size_t sVar6;
  uint uVar7;
  bool bVar8;
  float fVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Point current_point;
  Point p1;
  Point p2;
  Point local_b0;
  Point local_a8;
  size_t sStack_a0;
  Point local_90;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  string local_50;
  
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  sVar6 = (this->super_Parser).s.size;
  if (sVar6 != 0) {
    pbVar4 = (byte *)(this->super_Parser).s.s;
    do {
      sVar6 = sVar6 - 1;
      local_a8 = (Point)(this->super_Parser).s.s;
      sStack_a0 = (this->super_Parser).s.size;
      bVar1 = *pbVar4;
      (this->super_Parser).s.s = (char *)(pbVar4 + 1);
      (this->super_Parser).s.size = sVar6;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = (char *)local_a8;
        (this->super_Parser).s.size = sStack_a0;
        break;
      }
      pbVar4 = pbVar4 + 1;
    } while (sVar6 != 0);
  }
  sVar6 = (this->super_Parser).s.size;
  if (sVar6 != 0) {
    local_78 = 0.0;
    local_74 = 0.0;
    local_88 = 0.0;
    local_84 = 0.0;
    local_80 = 0.0;
    local_7c = 0.0;
    do {
      pbVar4 = (byte *)(this->super_Parser).s.s;
      bVar1 = *pbVar4;
      (this->super_Parser).s.s = (char *)(pbVar4 + 1);
      (this->super_Parser).s.size = sVar6 - 1;
      if (sVar6 - 1 != 0) {
        sVar6 = sVar6 - 2;
        pbVar4 = (byte *)(this->super_Parser).s.s;
        do {
          local_a8 = (Point)(this->super_Parser).s.s;
          sStack_a0 = (this->super_Parser).s.size;
          bVar2 = *pbVar4;
          (this->super_Parser).s.s = (char *)(pbVar4 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = (char *)local_a8;
            (this->super_Parser).s.size = sStack_a0;
            break;
          }
          bVar8 = sVar6 != 0;
          sVar6 = sVar6 - 1;
          pbVar4 = pbVar4 + 1;
        } while (bVar8);
      }
      uVar7 = (uint)bVar1;
      if (bVar1 < 0x61) {
        switch(bVar1) {
        case 0x41:
          sVar6 = (this->super_Parser).s.size;
          while ((sVar6 != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_68._8_4_ = extraout_XMM0_Dc;
            local_68._0_4_ = PVar5.x;
            local_68._4_4_ = PVar5.y;
            local_68._12_4_ = extraout_XMM0_Dd;
            local_6c = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            local_70 = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            fVar9 = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            bVar8 = local_70 != 0.0;
            local_b0 = parse_point(this);
            Path::arc_to(this->path,(Point)local_68._0_8_,local_6c,(bool)(-bVar8 & 1),
                         (bool)(-(fVar9 != 0.0) & 1),&local_b0);
            sVar6 = (this->super_Parser).s.size;
          }
          break;
        case 0x42:
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4e:
        case 0x4f:
        case 0x50:
        case 0x52:
        case 0x55:
switchD_00108e71_caseD_42:
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"unexpected command","");
          Parser::error(&this->super_Parser,&local_50);
        case 0x43:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8 = parse_point(this);
            local_90 = parse_point(this);
            local_b0 = parse_point(this);
            Path::curve_to(this->path,&local_a8,&local_90,&local_b0);
            local_84 = local_90.x;
            local_88 = local_90.y;
          }
          break;
        case 0x48:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            fVar9 = Parser::parse_number(&this->super_Parser);
            local_b0.x = fVar9;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x4c:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_b0 = parse_point(this);
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x4d:
          local_b0 = parse_point(this);
          Path::move_to(this->path,&local_b0);
          local_74 = local_b0.x;
          local_78 = local_b0.y;
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_b0 = parse_point(this);
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x51:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8 = parse_point(this);
            local_b0 = parse_point(this);
            Path::quadratic_curve_to(this->path,&local_a8,&local_b0);
            local_7c = local_a8.x;
            local_80 = local_a8.y;
          }
          break;
        case 0x53:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8.y = (local_b0.y + local_b0.y) - local_88;
            local_a8.x = (local_b0.x + local_b0.x) - local_84;
            local_90 = parse_point(this);
            local_b0 = parse_point(this);
            Path::curve_to(this->path,&local_a8,&local_90,&local_b0);
            local_84 = local_90.x;
            local_88 = local_90.y;
          }
          break;
        case 0x54:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8.y = (local_b0.y + local_b0.y) - local_80;
            local_a8.x = (local_b0.x + local_b0.x) - local_7c;
            local_b0 = parse_point(this);
            Path::quadratic_curve_to(this->path,&local_a8,&local_b0);
            local_7c = local_a8.x;
            local_80 = local_a8.y;
          }
          break;
        case 0x56:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            fVar9 = Parser::parse_number(&this->super_Parser);
            local_b0.y = fVar9;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            Path::line_to(this->path,&local_b0);
          }
          break;
        default:
          if (uVar7 != 0x5a) goto switchD_00108e71_caseD_42;
LAB_001099b8:
          (this->path->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].closed = true;
          local_b0.y = local_78;
          local_b0.x = local_74;
        }
      }
      else {
        switch(bVar1) {
        case 0x61:
          sVar6 = (this->super_Parser).s.size;
          while ((sVar6 != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_68._8_4_ = extraout_XMM0_Dc_00;
            local_68._0_4_ = PVar5.x;
            local_68._4_4_ = PVar5.y;
            local_68._12_4_ = extraout_XMM0_Dd_00;
            local_6c = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            local_70 = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            fVar9 = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            bVar8 = local_70 != 0.0;
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::arc_to(this->path,(Point)local_68._0_8_,local_6c,(bool)(-bVar8 & 1),
                         (bool)(-(fVar9 != 0.0) & 1),&local_b0);
            sVar6 = (this->super_Parser).s.size;
          }
          break;
        case 0x62:
        case 100:
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x72:
        case 0x75:
          goto switchD_00108e71_caseD_42;
        case 99:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_a8.y = PVar5.y + local_b0.y;
            local_a8.x = local_b0.x + PVar5.x;
            PVar5 = parse_point(this);
            local_90.y = PVar5.y + local_b0.y;
            local_90.x = local_b0.x + PVar5.x;
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::curve_to(this->path,&local_a8,&local_90,&local_b0);
            local_84 = local_90.x;
            local_88 = local_90.y;
          }
          break;
        case 0x68:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            fVar9 = Parser::parse_number(&this->super_Parser);
            local_b0.x = fVar9 + local_b0.x;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x6c:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x6d:
          PVar5 = parse_point(this);
          local_b0.y = PVar5.y + local_b0.y;
          local_b0.x = local_b0.x + PVar5.x;
          Path::move_to(this->path,&local_b0);
          local_74 = local_b0.x;
          local_78 = local_b0.y;
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::line_to(this->path,&local_b0);
          }
          break;
        case 0x71:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            PVar5 = parse_point(this);
            local_a8.y = PVar5.y + local_b0.y;
            local_a8.x = local_b0.x + PVar5.x;
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::quadratic_curve_to(this->path,&local_a8,&local_b0);
            local_7c = local_a8.x;
            local_80 = local_a8.y;
          }
          break;
        case 0x73:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8.y = (local_b0.y + local_b0.y) - local_88;
            local_a8.x = (local_b0.x + local_b0.x) - local_84;
            PVar5 = parse_point(this);
            local_90.y = PVar5.y + local_b0.y;
            local_90.x = local_b0.x + PVar5.x;
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::curve_to(this->path,&local_a8,&local_90,&local_b0);
            local_84 = local_90.x;
            local_88 = local_90.y;
          }
          break;
        case 0x74:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            local_a8.y = (local_b0.y + local_b0.y) - local_80;
            local_a8.x = (local_b0.x + local_b0.x) - local_7c;
            PVar5 = parse_point(this);
            local_b0.y = PVar5.y + local_b0.y;
            local_b0.x = local_b0.x + PVar5.x;
            Path::quadratic_curve_to(this->path,&local_a8,&local_b0);
            local_7c = local_a8.x;
            local_80 = local_a8.y;
          }
          break;
        case 0x76:
          while (((this->super_Parser).s.size != 0 &&
                 (cVar3 = *(this->super_Parser).s.s, cVar3 == '-' || (byte)(cVar3 - 0x30U) < 10))) {
            fVar9 = Parser::parse_number(&this->super_Parser);
            local_b0.y = fVar9 + local_b0.y;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar4 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8 = (Point)(this->super_Parser).s.s;
                sStack_a0 = (this->super_Parser).s.size;
                bVar2 = *pbVar4;
                (this->super_Parser).s.s = (char *)(pbVar4 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar2 != 0x2c) && ((bVar2 < 0x21 & (byte)(0x100002600 >> (bVar2 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = (char *)local_a8;
                  (this->super_Parser).s.size = sStack_a0;
                  break;
                }
                pbVar4 = pbVar4 + 1;
              } while (sVar6 != 0);
            }
            Path::line_to(this->path,&local_b0);
          }
          break;
        default:
          if (bVar1 != 0x7a) goto switchD_00108e71_caseD_42;
          goto LAB_001099b8;
        }
      }
      if (((0x20 < bVar1 - 0x43) || ((0x100010001U >> ((ulong)(bVar1 - 0x43) & 0x3f) & 1) == 0)) &&
         (uVar7 != 0x73)) {
        local_84 = local_b0.x;
        local_88 = local_b0.y;
      }
      if ((0x23 < uVar7 - 0x51) || ((0x900000009U >> ((ulong)(uVar7 - 0x51) & 0x3f) & 1) == 0)) {
        local_7c = local_b0.x;
        local_80 = local_b0.y;
      }
      sVar6 = (this->super_Parser).s.size;
    } while (sVar6 != 0);
  }
  return;
}

Assistant:

void parse() {
		Point current_point(0.f, 0.f);
		Point initial_point(0.f, 0.f);
		Point cubic_p2(0.f, 0.f);
		Point quadratic_p1(0.f, 0.f);
		parse_all(white_space);
		while (has_next()) {
			const Character command = next();
			parse_all(white_space);
			if (command == 'M') {
				current_point = parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'm') {
				current_point = current_point + parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'L') {
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'l') {
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'H') {
				while (copy().parse(number_start_char)) {
					current_point.x = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'h') {
				while (copy().parse(number_start_char)) {
					current_point.x += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'V') {
				while (copy().parse(number_start_char)) {
					current_point.y = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'v') {
				while (copy().parse(number_start_char)) {
					current_point.y += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'C') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'c') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'S') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 's') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'Q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'T') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 't') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'A') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'a') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = current_point + parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'Z' || command == 'z') {
				path.close();
				current_point = initial_point;
			}
			else {
				error("unexpected command");
			}
			if (command != 'C' && command != 'c' && command != 'S' && command != 's') {
				cubic_p2 = current_point;
			}
			if (command != 'Q' && command != 'q' && command != 'T' && command != 't') {
				quadratic_p1 = current_point;
			}
		}
	}